

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setDateTime(QDateTimeEdit *this,QDateTime *datetime)

{
  long lVar1;
  bool bVar2;
  QDateTimeEditPrivate *this_00;
  ulong uVar3;
  QVariant *in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDate date;
  QDateTime when;
  undefined8 in_stack_ffffffffffffff88;
  Section other;
  QAbstractSpinBoxPrivate *this_01;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_3c;
  undefined1 *local_38;
  QDate max;
  undefined8 in_stack_ffffffffffffffd8;
  
  other = (Section)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QDateTimeEdit *)0x55808f);
  uVar3 = QDateTime::isValid();
  if ((uVar3 & 1) != 0) {
    max.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    QDateTimeEditPrivate::convertTimeZone(this_00,(QDateTime *)in_RDI);
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xf8))();
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = (undefined1 *)QDateTime::date();
    local_3c.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         QFlags<QDateTimeEdit::Section>::operator&((QFlags<QDateTimeEdit::Section> *)in_RDI,other);
    bVar2 = QFlags<QDateTimeEdit::Section>::operator!((QFlags<QDateTimeEdit::Section> *)&local_3c);
    if (bVar2) {
      setDateRange((QDateTimeEdit *)this_01,(QDate)in_stack_ffffffffffffffd8,max);
    }
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,(QDateTime *)&stack0xffffffffffffffd0)
    ;
    QAbstractSpinBoxPrivate::setValue
              (this_01,in_RSI,(EmitPolicy)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setDateTime(const QDateTime &datetime)
{
    Q_D(QDateTimeEdit);
    if (datetime.isValid()) {
        QDateTime when = d->convertTimeZone(datetime);
        Q_ASSERT(when.timeRepresentation() == d->timeZone);

        d->clearCache();
        const QDate date = when.date();
        if (!(d->sections & DateSections_Mask))
            setDateRange(date, date);
        d->setValue(when, EmitIfChanged);
    }
}